

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freelist.h
# Opt level: O1

Node * __thiscall
sentencepiece::model::FreeList<sentencepiece::unigram::Lattice::Node>::Allocate
          (FreeList<sentencepiece::unigram::Lattice::Node> *this)

{
  pointer *pppNVar1;
  undefined8 *puVar2;
  ulong uVar3;
  iterator __position;
  size_t sVar4;
  undefined1 auVar5 [16];
  Node *pNVar6;
  long lVar7;
  ulong uVar8;
  Node *chunk;
  Node *local_28;
  
  uVar3 = this->chunk_size_;
  if (uVar3 <= this->element_index_) {
    this->chunk_index_ = this->chunk_index_ + 1;
    this->element_index_ = 0;
  }
  __position._M_current =
       (this->freelist_).
       super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (this->chunk_index_ ==
      (long)__position._M_current -
      (long)(this->freelist_).
            super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
            ._M_impl.super__Vector_impl_data._M_start >> 3) {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar3;
    uVar8 = 0xffffffffffffffff;
    if (SUB168(auVar5 * ZEXT816(0x30),8) == 0) {
      uVar8 = SUB168(auVar5 * ZEXT816(0x30),0);
    }
    pNVar6 = (Node *)operator_new__(uVar8);
    if (uVar3 != 0) {
      lVar7 = 0;
      do {
        puVar2 = (undefined8 *)((long)&(pNVar6->piece)._M_len + lVar7);
        *puVar2 = 0;
        puVar2[1] = 0;
        lVar7 = lVar7 + 0x30;
      } while (uVar3 * 0x30 != lVar7);
    }
    local_28 = pNVar6;
    memset(pNVar6,0,uVar3 * 0x30);
    if (__position._M_current ==
        (this->freelist_).
        super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<sentencepiece::unigram::Lattice::Node*,std::allocator<sentencepiece::unigram::Lattice::Node*>>
      ::_M_realloc_insert<sentencepiece::unigram::Lattice::Node*const&>
                ((vector<sentencepiece::unigram::Lattice::Node*,std::allocator<sentencepiece::unigram::Lattice::Node*>>
                  *)&this->freelist_,__position,&local_28);
    }
    else {
      *__position._M_current = pNVar6;
      pppNVar1 = &(this->freelist_).
                  super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppNVar1 = *pppNVar1 + 1;
    }
  }
  sVar4 = this->element_index_;
  pNVar6 = (this->freelist_).
           super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
           ._M_impl.super__Vector_impl_data._M_start[this->chunk_index_];
  this->element_index_ = sVar4 + 1;
  return pNVar6 + sVar4;
}

Assistant:

T* Allocate() {
    if (element_index_ >= chunk_size_) {
      ++chunk_index_;
      element_index_ = 0;
    }

    if (chunk_index_ == freelist_.size()) {
      T* chunk = new T[chunk_size_];
      memset(static_cast<void*>(chunk), 0, sizeof(*chunk) * chunk_size_);
      freelist_.push_back(chunk);
    }

    T* result = freelist_[chunk_index_] + element_index_;
    ++element_index_;

    return result;
  }